

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_identities(lys_module *mod)

{
  lysc_ident **identities;
  lysp_module *plVar1;
  lysp_include *plVar2;
  long lVar3;
  LY_ERR LVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  lysc_ctx ctx;
  
  memset(&ctx,0,0x10a0);
  identities = &mod->identities;
  LVar4 = lys_identity_precompile
                    ((lysc_ctx *)0x0,mod->ctx,mod->parsed,mod->parsed->identities,identities);
  if (LVar4 == LY_SUCCESS) {
    uVar7 = 0xffffffffffffffff;
    lVar6 = 0;
    do {
      plVar1 = mod->parsed;
      plVar2 = plVar1->includes;
      if (plVar2 == (lysp_include *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ulong *)(plVar2[-1].rev + 8);
      }
      uVar7 = uVar7 + 1;
      if (uVar5 <= uVar7) {
        ctx.cur_mod = plVar1->mod;
        ctx.ctx = (ctx.cur_mod)->ctx;
        ctx.ext = (lysc_ext_instance *)0x0;
        ctx.path_len = 1;
        ctx.path[0] = '/';
        ctx.pmod = plVar1;
        ctx.free_ctx.ctx = ctx.ctx;
        if ((plVar1->identities == (lysp_ident *)0x0) ||
           (LVar4 = lys_compile_identities_derived(&ctx,plVar1->identities,identities),
           LVar4 == LY_SUCCESS)) {
          lVar6 = 0;
          lysc_update_path(&ctx,(lys_module *)0x0,"{submodule}");
          uVar7 = 0;
          goto LAB_0013fa59;
        }
        break;
      }
      lVar3 = lVar6 + -0x28;
      lVar6 = lVar6 + 0x38;
      LVar4 = lys_identity_precompile
                        ((lysc_ctx *)0x0,mod->ctx,*(lysp_module **)(plVar2->rev + lVar3),
                         (*(lysp_module **)(plVar2->rev + lVar3))->identities,identities);
    } while (LVar4 == LY_SUCCESS);
  }
  goto LAB_0013fa1b;
LAB_0013fa59:
  plVar2 = mod->parsed->includes;
  if (plVar2 == (lysp_include *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ulong *)(plVar2[-1].rev + 8);
  }
  if (uVar7 < uVar5) {
    plVar1 = *(lysp_module **)(plVar2->rev + lVar6 + -0x28);
    if (plVar1->identities != (lysp_ident *)0x0) {
      ctx.pmod = plVar1;
      lysc_update_path(&ctx,(lys_module *)0x0,(char *)plVar1[1].mod);
      LVar4 = lys_compile_identities_derived(&ctx,plVar1->identities,identities);
      lysc_update_path(&ctx,(lys_module *)0x0,(char *)0x0);
      if (LVar4 != LY_SUCCESS) goto LAB_0013fac0;
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x38;
    goto LAB_0013fa59;
  }
  LVar4 = LY_SUCCESS;
LAB_0013fac0:
  lysc_update_path(&ctx,(lys_module *)0x0,(char *)0x0);
LAB_0013fa1b:
  ly_log_location_revert(0,0,1,0);
  return LVar4;
}

Assistant:

LY_ERR
lys_compile_identities(struct lys_module *mod)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_ctx ctx = {0};
    struct lysp_submodule *submod;
    LY_ARRAY_COUNT_TYPE u;

    /* pre-compile identities of the module and any submodules */
    rc = lys_identity_precompile(NULL, mod->ctx, mod->parsed, mod->parsed->identities, &mod->identities);
    LY_CHECK_GOTO(rc, cleanup);
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        submod = mod->parsed->includes[u].submodule;
        rc = lys_identity_precompile(NULL, mod->ctx, (struct lysp_module *)submod, submod->identities, &mod->identities);
        LY_CHECK_GOTO(rc, cleanup);
    }

    /* prepare context */
    LYSC_CTX_INIT_PMOD(ctx, mod->parsed, NULL);

    if (mod->parsed->identities) {
        rc = lys_compile_identities_derived(&ctx, mod->parsed->identities, &mod->identities);
        LY_CHECK_GOTO(rc, cleanup);
    }
    lysc_update_path(&ctx, NULL, "{submodule}");
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        submod = mod->parsed->includes[u].submodule;
        if (submod->identities) {
            ctx.pmod = (struct lysp_module *)submod;
            lysc_update_path(&ctx, NULL, submod->name);
            rc = lys_compile_identities_derived(&ctx, submod->identities, &mod->identities);
            lysc_update_path(&ctx, NULL, NULL);
        }

        if (rc) {
            break;
        }
    }
    lysc_update_path(&ctx, NULL, NULL);

cleanup:
    /* always needed when using lysc_update_path() */
    ly_log_location_revert(0, 0, 1, 0);
    return rc;
}